

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>::
find<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Entry,capnp::Type&>
          (HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks> *this,
          ArrayPtr<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry> table,
          Type *params)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  HandlerBase *pHVar6;
  ulong uVar7;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar8;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  Entry *pEVar9;
  Type *in_R8;
  ulong uVar10;
  ulong uVar11;
  HandlerBase *pHVar12;
  Maybe<unsigned_long> MVar13;
  
  pEVar9 = table.ptr;
  lVar3._0_2_ = pEVar9[1].key.baseType;
  lVar3._2_1_ = pEVar9[1].key.listDepth;
  lVar3._3_1_ = pEVar9[1].key.isImplicitParam;
  lVar3._4_2_ = pEVar9[1].key.field_3;
  lVar3._6_2_ = *(undefined2 *)&pEVar9[1].key.field_0x6;
  aVar8.value = table.size_;
  if (lVar3 != 0) {
    uVar5 = capnp::Type::hashCode(in_R8);
    pHVar6 = pEVar9->value;
    uVar7._0_2_ = pEVar9[1].key.baseType;
    uVar7._2_1_ = pEVar9[1].key.listDepth;
    uVar7._3_1_ = pEVar9[1].key.isImplicitParam;
    uVar7._4_2_ = pEVar9[1].key.field_3;
    uVar7._6_2_ = *(undefined2 *)&pEVar9[1].key.field_0x6;
    uVar10 = (ulong)((int)uVar7 - 1U & uVar5);
    uVar1 = *(uint *)((long)&pHVar6[uVar10]._vptr_HandlerBase + 4);
    aVar8.value._4_4_ = 0;
    aVar8.value._0_4_ = uVar1;
    if (uVar1 != 0) {
      pHVar12 = pHVar6 + uVar10;
      do {
        if (((int)aVar8.value != 1) && (*(uint *)&pHVar12->_vptr_HandlerBase == uVar5)) {
          bVar4 = capnp::Type::operator==
                            ((Type *)(table.size_ + (ulong)((int)aVar8.value - 2) * 0x18),in_R8);
          if (bVar4) {
            iVar2 = *(int *)((long)&pHVar12->_vptr_HandlerBase + 4);
            *this = (HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>)
                    0x1;
            *(ulong *)(this + 8) = (ulong)(iVar2 - 2);
            aVar8 = extraout_RDX;
            goto LAB_002f0a78;
          }
          pHVar6 = pEVar9->value;
          uVar7._0_2_ = pEVar9[1].key.baseType;
          uVar7._2_1_ = pEVar9[1].key.listDepth;
          uVar7._3_1_ = pEVar9[1].key.isImplicitParam;
          uVar7._4_2_ = pEVar9[1].key.field_3;
          uVar7._6_2_ = *(undefined2 *)&pEVar9[1].key.field_0x6;
        }
        uVar11 = uVar10 + 1;
        uVar10 = uVar11 & 0xffffffff;
        if (uVar11 == uVar7) {
          uVar10 = 0;
        }
        pHVar12 = pHVar6 + uVar10;
        uVar1 = *(uint *)((long)&pHVar12->_vptr_HandlerBase + 4);
        aVar8.value._4_4_ = 0;
        aVar8.value._0_4_ = uVar1;
      } while (uVar1 != 0);
    }
  }
  *this = (HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>)0x0;
LAB_002f0a78:
  MVar13.ptr.field_1.value = aVar8.value;
  MVar13.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar13.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return kj::none;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return kj::none;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }